

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidierror.cpp
# Opt level: O0

int RtMidiError_register(lua_State *L)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  pair<RtMidiError::Type,_const_char_*> *p;
  pair<RtMidiError::Type,_const_char_*> *__end1;
  pair<RtMidiError::Type,_const_char_*> *__begin1;
  pair<RtMidiError::Type,_const_char_*> (*__range1) [11];
  lua_State *L_local;
  
  iVar1 = luaL_newmetatable(L,"luartmidi.rtmidierror");
  if (iVar1 != 0) {
    lua_pushlstring(L,"__index",7);
    luaNewLib<6ul>(L,(luaL_Reg (*) [6])(anonymous_namespace)::RtMidiError_mt_index);
    lua_rawset(L,0xfffffffd);
    lua_pushlstring(L,"__tostring",10);
    lua_pushcclosure(L,anon_unknown.dwarf_1c1da::RtMidiError_getmessage,0);
    lua_rawset(L,0xfffffffd);
    lua_pushlstring(L,"__gc",4);
    lua_pushcclosure(L,anon_unknown.dwarf_1c1da::RtMidiError_dtor,0);
    lua_rawset(L,0xfffffffd);
  }
  lua_settop(L,0xfffffffe);
  lua_createtable(L,0);
  iVar1 = luaL_newmetatable(L,"luartmidi.rtmidierror.__class");
  if (iVar1 != 0) {
    lua_pushlstring(L,"__call",6);
    lua_pushcclosure(L,anon_unknown.dwarf_1c1da::RtMidiError_ctor,0);
    lua_rawset(L,0xfffffffd);
  }
  lua_setmetatable(L,0xfffffffe);
  lua_pushlstring(L,"Type",4);
  sVar2 = ARRAY_SIZE<std::pair<RtMidiError::Type,char_const*>,11ul>
                    ((pair<RtMidiError::Type,_const_char_*> (*) [11])
                     &(anonymous_namespace)::RTMIDIERROR_TYPE_VALUES);
  sVar3 = ARRAY_SIZE<std::pair<RtMidiError::Type,char_const*>,11ul>
                    ((pair<RtMidiError::Type,_const_char_*> (*) [11])
                     &(anonymous_namespace)::RTMIDIERROR_TYPE_VALUES);
  lua_createtable(L,sVar2 & 0xffffffff,sVar3 & 0xffffffff);
  for (__end1 = (pair<RtMidiError::Type,_const_char_*> *)
                &(anonymous_namespace)::RTMIDIERROR_TYPE_VALUES;
      __end1 != (pair<RtMidiError::Type,_const_char_*> *)(anonymous_namespace)::ChannelOut_mt_index;
      __end1 = __end1 + 1) {
    lua_pushstring(L,__end1->second);
    lua_rawseti(L,0xfffffffe,__end1->first);
    lua_pushstring(L,__end1->second);
    lua_pushinteger(L,__end1->first);
    lua_rawset(L,0xfffffffd);
  }
  lua_rawset(L,0xfffffffd);
  return 1;
}

Assistant:

LUA_RTMIDI_LOCAL int RtMidiError_register(lua_State *L) {
	// instance methods
	if (luaL_newmetatable(L, MT_RTMIDIERROR)) {
		lua_pushliteral(L, "__index");
		luaNewLib(L, RtMidiError_mt_index);
		lua_rawset(L, -3);

		lua_pushliteral(L, "__tostring");
		lua_pushcfunction(L, RtMidiError_getmessage);
		lua_rawset(L, -3);

		lua_pushliteral(L, "__gc");
		lua_pushcfunction(L, RtMidiError_dtor);
		lua_rawset(L, -3);
	}
	lua_pop(L, 1);

	// constructor
	lua_newtable(L);
	if (luaL_newmetatable(L, MT_RTMIDIERROR_CLASS)) {
		lua_pushliteral(L, "__call");
		lua_pushcfunction(L, RtMidiError_ctor);
		lua_rawset(L, -3);
	}
	lua_setmetatable(L, -2);

	lua_pushliteral(L, "Type");
	lua_createtable(L, ARRAY_SIZE(RTMIDIERROR_TYPE_VALUES), ARRAY_SIZE(RTMIDIERROR_TYPE_VALUES));
	for (const auto &p : RTMIDIERROR_TYPE_VALUES) {
		lua_pushstring(L, p.second);
		lua_rawseti(L, -2, p.first);
		lua_pushstring(L, p.second);
		lua_pushinteger(L, p.first);
		lua_rawset(L, -3);
	}
	lua_rawset(L, -3);

	return 1;
}